

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void __thiscall
mp::Error::Error<std::__cxx11::string,double>
          (Error *this,CStringRef arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,double *args_1)

{
  fmt::internal::RuntimeError::RuntimeError(&this->super_RuntimeError);
  *(undefined ***)&this->super_RuntimeError = &PTR__SystemError_001868e0;
  this->exit_code_ = 1;
  init(this,(EVP_PKEY_CTX *)arg0.data_);
  return;
}

Assistant:

Error(fmt::CStringRef msg, int c=-1) : exit_code_(c)
  { SetMessage(msg.c_str()); }